

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
          (ASTSerializer *this,UnbasedUnsizedIntegerLiteral *elem,bool inMembersArray)

{
  string_view name;
  LookupLocation lookupLocation;
  bool bVar1;
  size_t sVar2;
  Type *__n;
  reference ppAVar3;
  RootSymbol *pRVar4;
  byte in_DL;
  long in_RSI;
  SourceManager *in_RDI;
  ConstantValue constant;
  ASTContext ctx;
  AttributeSymbol *attr;
  iterator __end0;
  iterator __begin0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range4;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  Expression *in_stack_00000150;
  ASTContext *in_stack_00000158;
  SourceLocation end;
  SourceLocation start;
  SourceRange sr;
  SourceManager *sm;
  Symbol *in_stack_fffffffffffffda8;
  Compilation *in_stack_fffffffffffffdb0;
  Scope *scope;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *in_stack_fffffffffffffdb8;
  ASTContext *this_00;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffdc0;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  SourceManager *in_stack_fffffffffffffdd0;
  int __fd;
  SourceLocation in_stack_fffffffffffffde8;
  void *local_210;
  int local_208;
  SyntaxNode *in_stack_fffffffffffffe00;
  ASTSerializer *in_stack_fffffffffffffe18;
  SourceManager *in_stack_fffffffffffffe20;
  SourceLocation in_stack_fffffffffffffe28;
  SourceManager *in_stack_fffffffffffffe38;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe40;
  SourceLocation in_stack_fffffffffffffe48;
  ASTContext local_1a8;
  AttributeSymbol *local_170;
  AttributeSymbol **local_168;
  __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
  local_160;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_158;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_140;
  int local_130;
  void *local_128;
  string_view local_120;
  int local_110;
  void *local_108;
  SourceLocation local_100;
  int local_f8;
  void *local_f0;
  SourceLocation local_e8;
  int local_e0;
  void *local_d8;
  SourceLocation local_d0;
  int local_c8;
  void *local_c0;
  SourceLocation local_b8;
  int local_b0;
  void *local_a8;
  SourceLocation local_a0;
  string_view local_98;
  int local_88;
  void *local_80;
  SourceLocation local_78;
  string_view local_70;
  int local_60;
  void *local_58;
  SourceLocation local_50;
  SourceLocation local_48;
  SourceLocation local_40;
  SourceLocation local_38;
  SourceRange local_30;
  SourceManager *local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  JsonWriter::startObject((JsonWriter *)in_stack_fffffffffffffdd0);
  if (((*(long *)(local_10 + 0x18) != 0) &&
      (((in_RDI->mutex)._M_impl._M_rwlock.__size[0x11] & 1U) != 0)) &&
     (local_20 = Compilation::getSourceManager
                           ((Compilation *)(in_RDI->mutex)._M_impl._M_rwlock.__align),
     local_20 != (SourceManager *)0x0)) {
    local_30 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe00);
    in_stack_fffffffffffffdd0 = local_20;
    local_40 = SourceRange::start(&local_30);
    local_38 = SourceManager::getFullyExpandedLoc(in_RDI,in_stack_fffffffffffffde8);
    local_50 = SourceRange::end(&local_30);
    local_48 = SourceManager::getFullyExpandedLoc(in_RDI,in_stack_fffffffffffffde8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
               (char *)in_stack_fffffffffffffdb8);
    local_78 = local_38;
    local_70 = SourceManager::getFileName
                         (in_stack_fffffffffffffe38,(SourceLocation)in_stack_fffffffffffffe40.m_bits
                         );
    write((ASTSerializer *)in_RDI,local_60,local_58,local_70._M_len);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
               (char *)in_stack_fffffffffffffdb8);
    local_a0 = local_48;
    local_98 = SourceManager::getFileName
                         (in_stack_fffffffffffffe38,(SourceLocation)in_stack_fffffffffffffe40.m_bits
                         );
    write((ASTSerializer *)in_RDI,local_88,local_80,local_98._M_len);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
               (char *)in_stack_fffffffffffffdb8);
    local_b8 = local_38;
    sVar2 = SourceManager::getLineNumber
                      ((SourceManager *)in_stack_fffffffffffffe40.m_bits,in_stack_fffffffffffffe48);
    write((ASTSerializer *)in_RDI,local_b0,local_a8,sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
               (char *)in_stack_fffffffffffffdb8);
    local_d0 = local_48;
    sVar2 = SourceManager::getLineNumber
                      ((SourceManager *)in_stack_fffffffffffffe40.m_bits,in_stack_fffffffffffffe48);
    write((ASTSerializer *)in_RDI,local_c8,local_c0,sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
               (char *)in_stack_fffffffffffffdb8);
    local_e8 = local_38;
    sVar2 = SourceManager::getColumnNumber(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
    write((ASTSerializer *)in_RDI,local_e0,local_d8,sVar2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
               (char *)in_stack_fffffffffffffdb8);
    local_100 = local_48;
    sVar2 = SourceManager::getColumnNumber(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
    write((ASTSerializer *)in_RDI,local_f8,local_f0,sVar2);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
             (char *)in_stack_fffffffffffffdb8);
  local_120 = ast::toString(Invalid);
  write((ASTSerializer *)in_RDI,local_110,local_108,local_120._M_len);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
             (char *)in_stack_fffffffffffffdb8);
  __n = not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x522659);
  write((ASTSerializer *)in_RDI,local_130,local_128,(size_t)__n);
  local_140 = Compilation::getAttributes
                        (in_stack_fffffffffffffdb0,(Expression *)in_stack_fffffffffffffda8);
  bVar1 = std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                     0x5226a8);
  __fd = in_stack_fffffffffffffde8._0_4_;
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc0.m_bits,
               (char *)in_stack_fffffffffffffdb8);
    name._M_len._7_1_ = in_stack_fffffffffffffdcf;
    name._M_len._0_7_ = in_stack_fffffffffffffdc8;
    name._M_str = (char *)in_stack_fffffffffffffdd0;
    startArray((ASTSerializer *)in_stack_fffffffffffffdc0.m_bits,name);
    local_158 = &local_140;
    local_160._M_current =
         (AttributeSymbol **)
         std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffda8);
    local_168 = (AttributeSymbol **)
                std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end
                          (in_stack_fffffffffffffdb8);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffdb0,
                         (__normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffda8);
      __fd = in_stack_fffffffffffffde8._0_4_;
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppAVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                ::operator*(&local_160);
      local_170 = *ppAVar3;
      serialize((ASTSerializer *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,false);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::AttributeSymbol_*const_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
      ::operator++(&local_160);
    }
    endArray((ASTSerializer *)0x52277a);
  }
  UnbasedUnsizedIntegerLiteral::serializeTo
            ((UnbasedUnsizedIntegerLiteral *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  if (((in_RDI->mutex)._M_impl._M_rwlock.__size[0x13] & 1U) == 0) {
    if (*(long *)(local_10 + 0x10) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffffdc0.m_bits,(char *)in_stack_fffffffffffffdb8);
      write((ASTSerializer *)in_RDI,__fd,local_210,*(size_t *)(local_10 + 0x10));
    }
  }
  else {
    pRVar4 = Compilation::getRoot((Compilation *)0x5227a8);
    scope = &pRVar4->super_Scope;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe40,None);
    this_00 = &local_1a8;
    lookupLocation.scope._7_1_ = in_stack_fffffffffffffdcf;
    lookupLocation.scope._0_7_ = in_stack_fffffffffffffdc8;
    lookupLocation._8_8_ = in_stack_fffffffffffffdd0;
    ASTContext::ASTContext(this_00,scope,lookupLocation,in_stack_fffffffffffffdc0);
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe18;
    ASTContext::tryEval(in_stack_00000158,in_stack_00000150);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x522828);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_01,(char *)this_00);
      write((ASTSerializer *)in_RDI,local_208,in_stack_fffffffffffffe00,
            (size_t)&stack0xfffffffffffffe18);
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x52288a);
  }
  JsonWriter::endObject((JsonWriter *)in_RDI);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}